

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  ImGuiContextHook *pIVar4;
  ImGuiWindow *window;
  ImGuiViewportP *viewport;
  ImDrawData *pIVar5;
  ImVec2 cr_max;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  char cVar17;
  bool bVar18;
  ImU32 IVar19;
  ulong uVar20;
  ImDrawList *pIVar21;
  ImGuiWindow *pIVar22;
  char *__function;
  float fVar23;
  ImGuiContext *g;
  int iVar24;
  ImDrawList **ppIVar25;
  ulong uVar26;
  int n;
  long lVar27;
  ImGuiWindow *pIVar28;
  long lVar29;
  ImGuiViewportP *pIVar30;
  float fVar31;
  ImRect bb;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_90;
  ImVec2 IStack_88;
  ImGuiWindow *local_80;
  int local_74;
  ImGuiViewportP *local_70;
  ImVec4 local_68;
  int local_54;
  ImDrawList *local_50;
  ImGuiWindow *local_48 [3];
  
  pIVar15 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x140e,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  iVar24 = pIVar15->FrameCount;
  local_74 = pIVar15->FrameCountRendered;
  pIVar15->FrameCountRendered = iVar24;
  (pIVar15->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar15->Hooks).Size) {
    lVar27 = 0;
    lVar29 = 0;
    do {
      pIVar4 = (pIVar15->Hooks).Data;
      if (*(int *)(pIVar4 + lVar27 + 4) == 4) {
        (**(code **)(pIVar4 + lVar27 + 0x10))(pIVar15);
      }
      lVar29 = lVar29 + 1;
      lVar27 = lVar27 + 0x20;
    } while (lVar29 < (pIVar15->Hooks).Size);
  }
  uVar3 = (pIVar15->Viewports).Size;
  uVar20 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar26 = 0;
    do {
      if ((long)(int)uVar20 <= (long)uVar26) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_0015fe21;
      }
      pIVar30 = (pIVar15->Viewports).Data[uVar26];
      ImDrawDataBuilder::Clear(&pIVar30->DrawDataBuilder);
      if (pIVar30->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar21 = GetViewportDrawList(pIVar30,0,"##Background");
        AddDrawListToDrawData((pIVar30->DrawDataBuilder).Layers,pIVar21);
      }
      uVar26 = uVar26 + 1;
      uVar20 = (ulong)(uint)(pIVar15->Viewports).Size;
    } while (uVar26 != uVar20);
  }
  pIVar22 = pIVar15->NavWindowingTarget;
  if ((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x2000) != 0)) {
    pIVar28 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar28 = pIVar22->RootWindowDockTree;
  }
  local_48[0] = pIVar28;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar22 = pIVar15->NavWindowingListWindow;
  }
  local_48[1] = pIVar22;
  uVar3 = (pIVar15->Windows).Size;
  uVar20 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar26 = 0;
    do {
      if ((long)(int)uVar20 <= (long)uVar26) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_0015fe21:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,__function);
      }
      window = (pIVar15->Windows).Data[uVar26];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar22 && window != pIVar28) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
      }
      uVar26 = uVar26 + 1;
      uVar20 = (ulong)(uint)(pIVar15->Windows).Size;
    } while (uVar26 != uVar20);
  }
  lVar27 = 0;
  do {
    pIVar22 = local_48[lVar27];
    if (((pIVar22 != (ImGuiWindow *)0x0) && (pIVar22->Active == true)) && (pIVar22->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar22,(uint)pIVar22->Flags >> 0x19 & 1);
    }
    pIVar16 = GImGui;
    lVar27 = lVar27 + 1;
  } while (lVar27 == 1);
  local_54 = iVar24;
  if (local_74 != iVar24) {
    pIVar22 = GetTopMostAndVisiblePopupModal();
    if ((0.0 < pIVar16->DimBgRatio) || (0.0 < pIVar16->NavWindowingHighlightAlpha)) {
      pIVar28 = pIVar16->NavWindowingTargetAnim;
      if (pIVar28 == (ImGuiWindow *)0x0) {
        cVar17 = '\0';
      }
      else {
        cVar17 = pIVar28->Active;
      }
      if ((pIVar22 != (ImGuiWindow *)0x0) || (cVar17 != '\0')) {
        local_80 = pIVar22;
        if (pIVar22 == (ImGuiWindow *)0x0) {
          if (cVar17 == '\0') {
            local_70 = (ImGuiViewportP *)0x0;
            pIVar30 = (ImGuiViewportP *)0x0;
          }
          else {
            local_68.x = (pIVar16->Style).Colors[0x35].x;
            local_68.y = (pIVar16->Style).Colors[0x35].y;
            uVar8 = (pIVar16->Style).Colors[0x35].z;
            uVar9 = (pIVar16->Style).Colors[0x35].w;
            local_68.w = pIVar16->DimBgRatio * (pIVar16->Style).Alpha * (float)uVar9;
            local_68.z = (float)uVar8;
            IVar19 = ColorConvertFloat4ToU32(&local_68);
            RenderDimmedBackgroundBehindWindow(pIVar28,IVar19);
            pIVar22 = pIVar16->NavWindowingListWindow;
            if (((pIVar22 != (ImGuiWindow *)0x0) && (pIVar22->Viewport != (ImGuiViewportP *)0x0)) &&
               (pIVar22->Viewport != pIVar16->NavWindowingTargetAnim->Viewport)) {
              local_68.x = (GImGui->Style).Colors[0x35].x;
              local_68.y = (GImGui->Style).Colors[0x35].y;
              uVar10 = (GImGui->Style).Colors[0x35].z;
              uVar11 = (GImGui->Style).Colors[0x35].w;
              local_68.w = pIVar16->DimBgRatio * (GImGui->Style).Alpha * (float)uVar11;
              local_68.z = (float)uVar10;
              IVar19 = ColorConvertFloat4ToU32(&local_68);
              RenderDimmedBackgroundBehindWindow(pIVar22,IVar19);
            }
            pIVar22 = pIVar16->NavWindowingTargetAnim;
            pIVar30 = pIVar22->Viewport;
            if (pIVar16->NavWindowingListWindow == (ImGuiWindow *)0x0) {
              local_70 = (ImGuiViewportP *)0x0;
            }
            else {
              local_70 = pIVar16->NavWindowingListWindow->Viewport;
            }
            fVar31 = pIVar16->FontSize;
            local_90.x = (pIVar22->Pos).x - fVar31;
            local_90.y = (pIVar22->Pos).y - fVar31;
            IStack_88.x = (pIVar22->Pos).x + (pIVar22->Size).x + fVar31;
            IStack_88.y = (pIVar22->Pos).y + (pIVar22->Size).y + fVar31;
            if (((pIVar30->super_ImGuiViewport).Size.x <= IStack_88.x - local_90.x) &&
               ((pIVar30->super_ImGuiViewport).Size.y <= IStack_88.y - local_90.y)) {
              fVar31 = -1.0 - fVar31;
              local_90.x = local_90.x - fVar31;
              local_90.y = local_90.y - fVar31;
              IStack_88.x = IStack_88.x + fVar31;
              IStack_88.y = fVar31 + IStack_88.y;
            }
            if ((pIVar22->DrawList->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar22->DrawList);
            }
            cr_max.y = (pIVar30->super_ImGuiViewport).Pos.y + (pIVar30->super_ImGuiViewport).Size.y;
            cr_max.x = (pIVar30->super_ImGuiViewport).Pos.x + (pIVar30->super_ImGuiViewport).Size.x;
            ImDrawList::PushClipRect
                      (pIVar22->DrawList,(pIVar30->super_ImGuiViewport).Pos,cr_max,false);
            pIVar21 = pIVar22->DrawList;
            local_68.x = (GImGui->Style).Colors[0x34].x;
            local_68.y = (GImGui->Style).Colors[0x34].y;
            uVar12 = (GImGui->Style).Colors[0x34].z;
            uVar13 = (GImGui->Style).Colors[0x34].w;
            local_68.w = pIVar16->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar13
            ;
            local_68.z = (float)uVar12;
            IVar19 = ColorConvertFloat4ToU32(&local_68);
            ImDrawList::AddRect(pIVar21,&local_90,&IStack_88,IVar19,pIVar22->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar22->DrawList);
          }
        }
        else {
          pIVar22 = FindBottomMostVisibleWindowWithinBeginStack(pIVar22);
          local_68.x = (GImGui->Style).Colors[0x36].x;
          local_68.y = (GImGui->Style).Colors[0x36].y;
          uVar6 = (GImGui->Style).Colors[0x36].z;
          uVar7 = (GImGui->Style).Colors[0x36].w;
          local_68.w = pIVar16->DimBgRatio * (GImGui->Style).Alpha * (float)uVar7;
          local_68.z = (float)uVar6;
          IVar19 = ColorConvertFloat4ToU32(&local_68);
          RenderDimmedBackgroundBehindWindow(pIVar22,IVar19);
          pIVar30 = local_80->Viewport;
          local_70 = (ImGuiViewportP *)0x0;
        }
        if (0 < (pIVar16->Viewports).Size) {
          lVar27 = 0;
          pIVar22 = local_80;
          do {
            viewport = (pIVar16->Viewports).Data[lVar27];
            if ((viewport != pIVar30) && (viewport != local_70)) {
              if (pIVar22 == (ImGuiWindow *)0x0) {
                iVar24 = 0x35;
              }
              else {
                iVar24 = 0x36;
                if ((viewport->Window != (ImGuiWindow *)0x0) &&
                   (bVar18 = IsWindowAbove(viewport->Window,local_80), pIVar22 = local_80, bVar18))
                goto LAB_0015fbf5;
              }
              local_50 = GetViewportDrawList(viewport,1,"##Foreground");
              puVar2 = (undefined8 *)
                       ((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar24 << 4));
              local_68._0_8_ = *puVar2;
              uVar14 = puVar2[1];
              local_68.w = (float)((ulong)uVar14 >> 0x20);
              local_68.z = (float)uVar14;
              local_68.w = pIVar16->DimBgRatio * (GImGui->Style).Alpha * local_68.w;
              IVar19 = ColorConvertFloat4ToU32(&local_68);
              local_68.x = (viewport->super_ImGuiViewport).Pos.x +
                           (viewport->super_ImGuiViewport).Size.x;
              local_68.y = (viewport->super_ImGuiViewport).Pos.y +
                           (viewport->super_ImGuiViewport).Size.y;
              ImDrawList::AddRectFilled
                        (local_50,&(viewport->super_ImGuiViewport).Pos,(ImVec2 *)&local_68,IVar19,
                         0.0,0);
              pIVar22 = local_80;
            }
LAB_0015fbf5:
            lVar27 = lVar27 + 1;
          } while (lVar27 < (pIVar16->Viewports).Size);
        }
      }
    }
  }
  if (((local_74 != local_54 & (pIVar15->IO).MouseDrawCursor) == 1) && (pIVar15->MouseCursor != -1))
  {
    RenderMouseCursor((pIVar15->IO).MousePos,(pIVar15->Style).MouseCursorScale,pIVar15->MouseCursor,
                      0xffffffff,0xff000000,0x30000000);
  }
  (pIVar15->IO).MetricsRenderVertices = 0;
  (pIVar15->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar15->Viewports).Size) {
    lVar27 = 0;
    do {
      pIVar30 = (pIVar15->Viewports).Data[lVar27];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar30->DrawDataBuilder);
      if (pIVar30->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar21 = GetViewportDrawList(pIVar30,1,"##Foreground");
        AddDrawListToDrawData((pIVar30->DrawDataBuilder).Layers,pIVar21);
      }
      pIVar16 = GImGui;
      if (GImGui == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0xeed,"ImGuiIO &ImGui::GetIO()");
      }
      uVar3 = (pIVar30->super_ImGuiViewport).Flags;
      (pIVar30->super_ImGuiViewport).DrawData = &pIVar30->DrawDataP;
      (pIVar30->DrawDataP).Valid = true;
      iVar24 = (pIVar30->DrawDataBuilder).Layers[0].Size;
      if (iVar24 < 1) {
        ppIVar25 = (ImDrawList **)0x0;
      }
      else {
        ppIVar25 = (pIVar30->DrawDataBuilder).Layers[0].Data;
      }
      fVar23 = 0.0;
      (pIVar30->DrawDataP).CmdLists = ppIVar25;
      (pIVar30->DrawDataP).CmdListsCount = iVar24;
      (pIVar30->DrawDataP).TotalIdxCount = 0;
      (pIVar30->DrawDataP).TotalVtxCount = 0;
      (pIVar30->DrawDataP).DisplayPos = (pIVar30->super_ImGuiViewport).Pos;
      fVar31 = 0.0;
      if ((uVar3 >> 10 & 1) == 0) {
        fVar31 = (pIVar30->super_ImGuiViewport).Size.x;
        fVar23 = (pIVar30->super_ImGuiViewport).Size.y;
      }
      (pIVar30->DrawDataP).DisplaySize.x = fVar31;
      (pIVar30->DrawDataP).DisplaySize.y = fVar23;
      (pIVar30->DrawDataP).FramebufferScale = (pIVar16->IO).DisplayFramebufferScale;
      (pIVar30->DrawDataP).OwnerViewport = &pIVar30->super_ImGuiViewport;
      if (0 < iVar24) {
        lVar29 = 0;
        do {
          pIVar21 = (pIVar30->DrawDataBuilder).Layers[0].Data[lVar29];
          ImDrawList::_PopUnusedDrawCmd(pIVar21);
          piVar1 = &(pIVar30->DrawDataP).TotalVtxCount;
          *piVar1 = *piVar1 + (pIVar21->VtxBuffer).Size;
          piVar1 = &(pIVar30->DrawDataP).TotalIdxCount;
          *piVar1 = *piVar1 + (pIVar21->IdxBuffer).Size;
          lVar29 = lVar29 + 1;
        } while (lVar29 < (pIVar30->DrawDataBuilder).Layers[0].Size);
      }
      pIVar5 = (pIVar30->super_ImGuiViewport).DrawData;
      piVar1 = &(pIVar15->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + pIVar5->TotalVtxCount;
      piVar1 = &(pIVar15->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + pIVar5->TotalIdxCount;
      lVar27 = lVar27 + 1;
    } while (lVar27 < (pIVar15->Viewports).Size);
  }
  if (0 < (pIVar15->Hooks).Size) {
    lVar27 = 0;
    lVar29 = 0;
    do {
      pIVar4 = (pIVar15->Hooks).Data;
      if (*(int *)(pIVar4 + lVar27 + 4) == 5) {
        (**(code **)(pIVar4 + lVar27 + 0x10))(pIVar15,pIVar4 + lVar27);
      }
      lVar29 = lVar29 + 1;
      lVar27 = lVar27 + 0x20;
    } while (lVar29 < (pIVar15->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}